

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::AddBoard(BasePort *this,BoardIO *board)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  
  bVar1 = board->BoardId;
  if (bVar1 < 0x10) {
    this->BoardList[bVar1] = board;
    board->port = this;
    (**board->_vptr_BoardIO)(board);
    SetReadBufferBroadcast(this);
    SetWriteBufferBroadcast(this);
    if (this->max_board < (uint)bVar1 || this->max_board == (uint)bVar1) {
      this->max_board = bVar1 + 1;
    }
    this->BoardInUseMask_ = this->BoardInUseMask_ | 1 << (bVar1 & 0x1f);
    (this->bcReadInfo).boardInfo[bVar1].inUse = true;
    this->NumOfBoards_ = this->NumOfBoards_ + 1;
    uVar2 = GetBroadcastReadSizeQuads(this);
    (this->bcReadInfo).readSizeQuads = uVar2;
  }
  else {
    poVar3 = std::operator<<(this->outStr,"BasePort::AddBoard: board number out of range: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return bVar1 < 0x10;
}

Assistant:

bool BasePort::AddBoard(BoardIO *board)
{
    unsigned int id = board->BoardId;
    if (id >= BoardIO::MAX_BOARDS) {
        outStr << "BasePort::AddBoard: board number out of range: " << id << std::endl;
        return false;
    }
    BoardList[id] = board;
    board->port = this;
    board->InitBoard();

    // Make sure read/write buffers are allocated
    SetReadBufferBroadcast();
    SetWriteBufferBroadcast();

    if (id >= max_board)
        max_board = id+1;
    // update BoardInUseMask_
    BoardInUseMask_ = (BoardInUseMask_ | (1 << id));
    bcReadInfo.boardInfo[id].inUse = true;
    NumOfBoards_++;   // increment board counts

    bcReadInfo.readSizeQuads = GetBroadcastReadSizeQuads();

    return true;
}